

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O1

Shrinkables<int> * __thiscall
rc::gen::detail::generateShrinkables<int,rc::fn::Constant<bool>>
          (Shrinkables<int> *__return_storage_ptr__,detail *this,Random *random,int size,
          size_t count,Gen<int> *gen,Constant<bool> predicate)

{
  GenerationFailure *this_00;
  long *plVar1;
  undefined4 in_register_0000000c;
  size_type __n;
  long lVar2;
  size_type *psVar3;
  int iVar4;
  Random *pRVar5;
  Shrinkable<int> shrinkable;
  Random r;
  Gen<int> local_128;
  string local_100;
  Random local_e0;
  Random local_88;
  
  __n = CONCAT44(in_register_0000000c,size);
  pRVar5 = &local_88;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pRVar5->m_key)._M_elems[0] = *(unsigned_long *)this;
    this = this + 8;
    pRVar5 = (Random *)((pRVar5->m_key)._M_elems + 1);
  }
  (__return_storage_ptr__->
  super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>::reserve
            (__return_storage_ptr__,__n);
  if ((ulong)((long)(__return_storage_ptr__->
                    super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < __n) {
    iVar4 = 0;
    do {
      Random::split(&local_e0,&local_88);
      Gen<int>::operator()(&local_128,(Random *)count,(int)&local_e0);
      if (((ulong)gen & 1) == 0) {
        if (0x62 < iVar4) {
          this_00 = (GenerationFailure *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_100,__n);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e0,"Gave up trying to generate ",&local_100);
          plVar1 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_128.m_name._M_dataplus._M_p = (pointer)*plVar1;
          psVar3 = (size_type *)(plVar1 + 2);
          if ((size_type *)local_128.m_name._M_dataplus._M_p == psVar3) {
            local_128.m_name.field_2._M_allocated_capacity = *psVar3;
            local_128.m_name.field_2._8_8_ = plVar1[3];
            local_128.m_name._M_dataplus._M_p = (pointer)&local_128.m_name.field_2;
          }
          else {
            local_128.m_name.field_2._M_allocated_capacity = *psVar3;
          }
          local_128.m_name._M_string_length = plVar1[1];
          *plVar1 = (long)psVar3;
          plVar1[1] = 0;
          *(undefined1 *)(plVar1 + 2) = 0;
          GenerationFailure::GenerationFailure(this_00,&local_128.m_name);
          __cxa_throw(this_00,&GenerationFailure::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar4 = iVar4 + 1;
      }
      else {
        iVar4 = 0;
        std::vector<rc::Shrinkable<int>,std::allocator<rc::Shrinkable<int>>>::
        emplace_back<rc::Shrinkable<int>>
                  ((vector<rc::Shrinkable<int>,std::allocator<rc::Shrinkable<int>>> *)
                   __return_storage_ptr__,(Shrinkable<int> *)&local_128);
      }
      if (local_128.m_impl != (IGenImpl *)0x0) {
        (*(local_128.m_impl)->_vptr_IGenImpl[3])();
      }
    } while ((ulong)((long)(__return_storage_ptr__->
                           super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->
                           super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) < __n);
  }
  return __return_storage_ptr__;
}

Assistant:

Shrinkables<T> generateShrinkables(const Random &random,
                                   int size,
                                   std::size_t count,
                                   const Gen<T> &gen,
                                   Predicate predicate) {
  Random r(random);
  Shrinkables<T> shrinkables;
  shrinkables.reserve(count);

  auto currentSize = size;
  int tries = 0;
  while (shrinkables.size() < count) {
    auto shrinkable = gen(r.split(), currentSize);
    if (predicate(shrinkable)) {
      shrinkables.push_back(std::move(shrinkable));
      tries = 0;
    } else {
      tries++;
      if (tries >= 100) {
        // TODO magic constant!
        throw GenerationFailure("Gave up trying to generate " +
                                std::to_string(count) +
                                " values for container");
      }
      currentSize++;
    }
  }

  return shrinkables;
}